

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_io.c
# Opt level: O0

int kvtree_file_lock_read_write(char *file,int fd,int write)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  int *piVar4;
  char *pcVar5;
  uint local_24;
  int op;
  int write_local;
  int fd_local;
  char *file_local;
  
  if (write == 0) {
    local_24 = 1;
  }
  else {
    local_24 = 2;
  }
  iVar2 = flock(fd,local_24);
  if (iVar2 != 0) {
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    kvtree_err("Failed to acquire file lock on %s: flock(%d, %d) errno=%d %s @ %s:%d",file,
               (ulong)(uint)fd,(ulong)local_24,(ulong)uVar1,pcVar5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
               ,0x98);
  }
  file_local._4_4_ = (uint)(iVar2 != 0);
  return file_local._4_4_;
}

Assistant:

int kvtree_file_lock_read_write(const char* file, int fd, int write)
{
  #ifdef KVTREE_FILE_LOCK_USE_FLOCK
    int op;
    if (write) {
        op = LOCK_EX;
    } else {
        op = LOCK_SH;
    }
    if (flock(fd, op) != 0) {
      kvtree_err("Failed to acquire file lock on %s: flock(%d, %d) errno=%d %s @ %s:%d",
        file, fd, op, errno, strerror(errno), __FILE__, __LINE__
      );
      return KVTREE_FAILURE;
    }
  #endif

  #ifdef KVTREE_FILE_LOCK_USE_FCNTL
    struct flock lck;
    if (write) {
      lck.l_type = F_WRLCK;
    } else {
      lck.l_type = F_RDLCK;
    }
    lck.l_whence = SEEK_SET;
    lck.l_start = 0L;
    lck.l_len = 0L; //locking the entire file

    if(fcntl(fd, F_SETLKW, &lck) < 0) {
      kvtree_err("Failed to acquire file read lock on %s: fnctl(%d, %d) errno=%d %s @ %s:%d",
        file, fd, F_WRLCK, errno, strerror(errno), __FILE__, __LINE__
      );
      return KVTREE_FAILURE;
    }
  #endif

  return KVTREE_SUCCESS;
}